

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_post.c
# Opt level: O0

int post_form(FORM *form)

{
  short sVar1;
  int *piVar2;
  int local_48;
  int local_44;
  WINDOW_conflict *local_40;
  WINDOW_conflict *local_38;
  int width;
  int height;
  int page;
  int err;
  WINDOW_conflict *formwin;
  FORM *form_local;
  
  if (form == (FORM *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = -2;
    form_local._4_4_ = -2;
  }
  else if ((form->status & 1) == 0) {
    if (form->field == (FIELD **)0x0) {
      piVar2 = __errno_location();
      *piVar2 = -0xb;
      form_local._4_4_ = -0xb;
    }
    else {
      if (form->sub == (WINDOW_conflict *)0x0) {
        if (form->win == (WINDOW_conflict *)0x0) {
          local_40 = _stdscr;
        }
        else {
          local_40 = form->win;
        }
        local_38 = local_40;
      }
      else {
        local_38 = form->sub;
      }
      if (local_38 == (WINDOW_conflict *)0x0) {
        local_44 = -1;
        local_48 = -1;
      }
      else {
        local_44 = local_38->_maxy + 1;
        local_48 = local_38->_maxx + 1;
      }
      if ((local_48 < form->cols) || (local_44 < form->rows)) {
        piVar2 = __errno_location();
        *piVar2 = -6;
        form_local._4_4_ = -6;
      }
      else {
        sVar1 = form->curpage;
        form->curpage = -1;
        form_local._4_4_ = _nc_Set_Form_Page(form,(int)sVar1,form->current);
        if (form_local._4_4_ == 0) {
          form->status = form->status | 1;
          if ((form != (FORM *)0x0) && (form->forminit != (_func_void_formnode_ptr *)0x0)) {
            form->status = form->status | 2;
            (*form->forminit)(form);
            form->status = form->status & 0xfffd;
          }
          if ((form != (FORM *)0x0) && (form->fieldinit != (_func_void_formnode_ptr *)0x0)) {
            form->status = form->status | 2;
            (*form->fieldinit)(form);
            form->status = form->status & 0xfffd;
          }
          _nc_Refresh_Current_Field(form);
          piVar2 = __errno_location();
          *piVar2 = 0;
          form_local._4_4_ = 0;
        }
        else {
          piVar2 = __errno_location();
          *piVar2 = form_local._4_4_;
        }
      }
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = -3;
    form_local._4_4_ = -3;
  }
  return form_local._4_4_;
}

Assistant:

int post_form(FORM * form)
{
  WINDOW *formwin;
  int err;
  int page;
  int height, width;

  if (!form)
    RETURN(E_BAD_ARGUMENT);

  if (form->status & _POSTED)   
    RETURN(E_POSTED);

  if (!(form->field))
    RETURN(E_NOT_CONNECTED);
  
  formwin = Get_Form_Window(form);
  getmaxyx(formwin, height, width);
  if ((form->cols > width) || (form->rows > height))
    RETURN(E_NO_ROOM);

  /* reset form->curpage to an invalid value. This forces Set_Form_Page
     to do the page initialization which is required by post_form.
  */
  page = form->curpage;
  form->curpage = -1;
  if ((err = _nc_Set_Form_Page(form,page,form->current))!=E_OK)
    RETURN(err);

  form->status |= _POSTED;

  Call_Hook(form,forminit);
  Call_Hook(form,fieldinit);

  _nc_Refresh_Current_Field(form);
  RETURN(E_OK);
}